

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdtsc.c
# Opt level: O0

void cpu_tsc_unmark(cpu_mark_t *mark)

{
  undefined1 local_20 [8];
  cpu_mark_t temp;
  cpu_mark_t *mark_local;
  
  temp.sys_clock = (uint64_t)mark;
  cpu_tsc_mark((cpu_mark_t *)local_20);
  mark_t_subtract((cpu_mark_t *)local_20,(cpu_mark_t *)temp.sys_clock,(cpu_mark_t *)temp.sys_clock);
  return;
}

Assistant:

void cpu_tsc_unmark(struct cpu_mark_t* mark)
{
	struct cpu_mark_t temp;
	cpu_tsc_mark(&temp);
	mark_t_subtract(&temp, mark, mark);
}